

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

int isscalar(Context *ctx,MOJOSHADER_shaderType shader_type,RegisterType rtype,int rnum)

{
  int iVar1;
  int iVar2;
  RegisterList *pRVar3;
  bool bVar4;
  
  switch(rtype) {
  case REG_TYPE_RASTOUT:
    bVar4 = rnum - 1U < 2;
    break;
  case REG_TYPE_OUTPUT:
    iVar1 = ctx->uses_pointsize;
    iVar2 = ctx->uses_fog;
    if ((iVar1 != 0 || iVar2 != 0) &&
       (pRVar3 = reglist_find(&ctx->attributes,REG_TYPE_OUTPUT,rnum), pRVar3 != (RegisterList *)0x0)
       ) {
      bVar4 = pRVar3->usage == MOJOSHADER_USAGE_FOG && iVar2 != 0 ||
              pRVar3->usage == MOJOSHADER_USAGE_POINTSIZE && iVar1 != 0;
      break;
    }
  default:
    bVar4 = false;
    break;
  case REG_TYPE_DEPTHOUT:
  case REG_TYPE_CONSTBOOL:
  case REG_TYPE_LOOP:
    bVar4 = true;
    break;
  case REG_TYPE_MISCTYPE:
    shader_type = rnum;
    goto LAB_00116e03;
  case REG_TYPE_MAX:
LAB_00116e03:
    bVar4 = shader_type == MOJOSHADER_TYPE_PIXEL;
  }
  return (int)bVar4;
}

Assistant:

static int isscalar(Context *ctx, const MOJOSHADER_shaderType shader_type,
                    const RegisterType rtype, const int rnum)
{
    const int uses_psize = ctx->uses_pointsize;
    const int uses_fog = ctx->uses_fog;
    if ( (rtype == REG_TYPE_OUTPUT) && ((uses_psize) || (uses_fog)) )
    {
        const RegisterList *reg = reglist_find(&ctx->attributes, rtype, rnum);
        if (reg != NULL)
        {
            const MOJOSHADER_usage usage = reg->usage;
            return ( (uses_psize && (usage == MOJOSHADER_USAGE_POINTSIZE)) ||
                     (uses_fog && (usage == MOJOSHADER_USAGE_FOG)) );
        } // if
    } // if

    return scalar_register(shader_type, rtype, rnum);
}